

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O0

void configuration_object_destroy(configuration config)

{
  long *in_RDI;
  value in_stack_00000070;
  
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
  }
  if (in_RDI[1] != 0) {
    free((void *)in_RDI[1]);
  }
  if (in_RDI[4] != 0) {
    free((void *)in_RDI[4]);
  }
  set_destroy((set)config);
  if (in_RDI[5] != 0) {
    value_type_destroy(in_stack_00000070);
  }
  free(in_RDI);
  return;
}

Assistant:

void configuration_object_destroy(configuration config)
{
	if (config->name != NULL)
	{
		free(config->name);
	}

	if (config->path != NULL)
	{
		free(config->path);
	}

	if (config->source != NULL)
	{
		free(config->source);
	}

	set_destroy(config->map);

	if (config->v != NULL)
	{
		value_type_destroy(config->v);
	}

	free(config);
}